

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O2

void yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)

{
  uint uVar1;
  yaml_node_t *ptr;
  void *ptr_00;
  yaml_document_t *pyVar2;
  long lVar3;
  long lVar4;
  
  if (emitter->anchors == (yaml_anchors_t *)0x0) {
    yaml_document_delete(emitter->document);
  }
  else {
    lVar4 = 8;
    for (lVar3 = 0; ptr = (emitter->document->nodes).start,
        (yaml_node_t *)((long)&ptr->type + lVar3) < (emitter->document->nodes).top;
        lVar3 = lVar3 + 0x60) {
      uVar1 = *(uint *)((long)&ptr->type + lVar3);
      ptr_00 = *(void **)((long)&ptr->data + lVar3);
      if (*(int *)((long)&emitter->anchors->references + lVar4) == 0) {
        yaml_free(*(void **)((long)&ptr->tag + lVar3));
        if (uVar1 - 1 < 3) goto LAB_001056ad;
      }
      else if ((uVar1 & 0xfffffffe) == 2) {
LAB_001056ad:
        yaml_free(ptr_00);
      }
      lVar4 = lVar4 + 0xc;
    }
    yaml_free(ptr);
    pyVar2 = emitter->document;
    (pyVar2->nodes).start = (yaml_node_t *)0x0;
    (pyVar2->nodes).end = (yaml_node_t *)0x0;
    (pyVar2->nodes).top = (yaml_node_t *)0x0;
    yaml_free(emitter->anchors);
    emitter->anchors = (yaml_anchors_t *)0x0;
    emitter->last_anchor_id = 0;
  }
  emitter->document = (yaml_document_t *)0x0;
  return;
}

Assistant:

static void
yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)
{
    int index;

    if (!emitter->anchors) {
        yaml_document_delete(emitter->document);
        emitter->document = NULL;
        return;
    }

    for (index = 0; emitter->document->nodes.start + index
            < emitter->document->nodes.top; index ++) {
        yaml_node_t node = emitter->document->nodes.start[index];
        if (!emitter->anchors[index].serialized) {
            yaml_free(node.tag);
            if (node.type == YAML_SCALAR_NODE) {
                yaml_free(node.data.scalar.value);
            }
        }
        if (node.type == YAML_SEQUENCE_NODE) {
            STACK_DEL(emitter, node.data.sequence.items);
        }
        if (node.type == YAML_MAPPING_NODE) {
            STACK_DEL(emitter, node.data.mapping.pairs);
        }
    }

    STACK_DEL(emitter, emitter->document->nodes);
    yaml_free(emitter->anchors);

    emitter->anchors = NULL;
    emitter->last_anchor_id = 0;
    emitter->document = NULL;
}